

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int lat_fwd_bwd(s3lattice_t *lat)

{
  double dVar1;
  double dVar2;
  uint32 uVar3;
  float64 fVar4;
  double dVar5;
  float64 lm_score;
  float64 ac_score;
  uint local_18;
  uint32 id;
  int j;
  int i;
  s3lattice_t *lat_local;
  
  for (id = 0; id < lat->n_arcs; id = id + 1) {
    lat->arc[(int)id].alpha = -10000000000.0;
    if (lat->arc[(int)id].good_arc == 1) {
      dVar1 = (double)lat->arc[(int)id].ac_score;
      dVar5 = (double)(float)lm_scale;
      dVar2 = (double)lat->arc[(int)id].lm_score;
      for (local_18 = 0; local_18 < lat->arc[(int)id].n_prev_arcs; local_18 = local_18 + 1) {
        uVar3 = lat->arc[(int)id].prev_arcs[(int)local_18];
        if (uVar3 == 0) {
          if (lat->arc[(int)id].sf == 1) {
            fVar4 = log_add(lat->arc[(int)id].alpha,0.0);
            lat->arc[(int)id].alpha = fVar4;
          }
        }
        else if (lat->arc[uVar3 - 1].good_arc == 1) {
          fVar4 = log_add(lat->arc[(int)id].alpha,lat->arc[uVar3 - 1].alpha);
          lat->arc[(int)id].alpha = fVar4;
        }
      }
      lat->arc[(int)id].alpha = (float64)(dVar1 / dVar5 + dVar2 + (double)lat->arc[(int)id].alpha);
    }
  }
  lat->prob = -10000000000.0;
  id = lat->n_arcs;
  while (id = id - 1, -1 < (int)id) {
    lat->arc[(int)id].beta = -10000000000.0;
    if (lat->arc[(int)id].good_arc == 1) {
      dVar1 = (double)lat->arc[(int)id].ac_score;
      dVar5 = (double)(float)lm_scale;
      dVar2 = (double)lat->arc[(int)id].lm_score;
      for (local_18 = 0; local_18 < lat->arc[(int)id].n_next_arcs; local_18 = local_18 + 1) {
        uVar3 = lat->arc[(int)id].next_arcs[(int)local_18];
        if (uVar3 == 0) {
          fVar4 = log_add(lat->arc[(int)id].beta,0.0);
          lat->arc[(int)id].beta = fVar4;
        }
        else {
          fVar4 = log_add(lat->arc[(int)id].beta,lat->arc[uVar3 - 1].beta);
          lat->arc[(int)id].beta = fVar4;
        }
      }
      lat->arc[(int)id].beta = (float64)(dVar1 / dVar5 + dVar2 + (double)lat->arc[(int)id].beta);
      if (lat->arc[(int)id].sf == 1) {
        fVar4 = log_add(lat->prob,lat->arc[(int)id].beta);
        lat->prob = fVar4;
      }
    }
  }
  for (id = 0; id < lat->n_arcs; id = id + 1) {
    lat->arc[(int)id].gamma = -10000000000.0;
    if (lat->arc[(int)id].good_arc == 1) {
      lat->arc[(int)id].gamma =
           (float64)(((double)lat->arc[(int)id].alpha + (double)lat->arc[(int)id].beta) -
                    ((double)lat->arc[(int)id].ac_score / (double)(float)lm_scale +
                     (double)lat->arc[(int)id].lm_score + (double)lat->prob));
    }
  }
  lat->postprob = 0.0;
  for (id = lat->n_arcs - lat->n_true_arcs; id < lat->n_arcs; id = id + 1) {
    lat->postprob = (float64)((double)lat->arc[(int)id].gamma + (double)lat->postprob);
  }
  return 0;
}

Assistant:

int
lat_fwd_bwd(s3lattice_t *lat)
{
  int i, j;
  uint32 id;
  float64 ac_score, lm_score;

  /* step forward */
  for (i=0; i<lat->n_arcs; i++) {
    /* initialise alpha */
    lat->arc[i].alpha = LOG_ZERO;
    if (lat->arc[i].good_arc == 1) {
      /* get the acoustic and lm socre for a word hypothesis */
      ac_score = lat->arc[i].ac_score / lm_scale;
      lm_score = lat->arc[i].lm_score;

      /* compute alpha */
      for (j=0; j<lat->arc[i].n_prev_arcs; j++) {
	id = lat->arc[i].prev_arcs[j];
	if (id == 0) {
	  if (lat->arc[i].sf == 1) {
	    lat->arc[i].alpha = log_add(lat->arc[i].alpha, 0);
	  }
	}
	else {
	  if (lat->arc[id-1].good_arc == 1)
	    lat->arc[i].alpha = log_add(lat->arc[i].alpha, lat->arc[id-1].alpha);
	}
      }
      lat->arc[i].alpha += ac_score + lm_score;
    }
  }

  /* initialise overall log-likelihood */
  lat->prob = LOG_ZERO;

  /* step backward */
  for (i=lat->n_arcs-1; i>=0 ;i--) {
    /* initialise beta */
    lat->arc[i].beta = LOG_ZERO;

    if (lat->arc[i].good_arc == 1) {
      /* get the acoustic and lm socre for a word hypothesis */
      ac_score = lat->arc[i].ac_score / lm_scale;
      lm_score = lat->arc[i].lm_score;

      /* compute beta */
      for (j=0; j<lat->arc[i].n_next_arcs; j++) {
	id = lat->arc[i].next_arcs[j];
	if (id == 0) {
	  lat->arc[i].beta = log_add(lat->arc[i].beta, 0);
	}
	else {
	  if (lat->arc[id-1].good_arc == 1)
        ;
	  lat->arc[i].beta = log_add(lat->arc[i].beta, lat->arc[id-1].beta);
	}
      }
      lat->arc[i].beta += ac_score + lm_score;

      /* compute overall log-likelihood loglid=beta(1)=alpha(Q) */
      if (lat->arc[i].sf == 1)
	lat->prob = log_add(lat->prob, lat->arc[i].beta);
    }
  }

  /* compute gamma */
  for (i=0; i<lat->n_arcs; i++)
    {
      /* initialise gamma */
      lat->arc[i].gamma = LOG_ZERO;
      if (lat->arc[i].good_arc == 1)
	{
	  ac_score = lat->arc[i].ac_score / lm_scale;
	  lm_score = lat->arc[i].lm_score;
	  lat->arc[i].gamma = lat->arc[i].alpha + lat->arc[i].beta - (ac_score + lm_score + lat->prob);
	}
    }

  /* compute the posterior probability of the true path */
  lat->postprob = 0;
  for (i=lat->n_arcs-lat->n_true_arcs; i<lat->n_arcs; i++)
    lat->postprob += lat->arc[i].gamma;
  
  return S3_SUCCESS;
}